

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseOptionNamePart
          (Parser *this,UninterpretedOption *uninterpreted_option,LocationRecorder *part_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *psVar2;
  ErrorMaker local_120;
  undefined1 local_110 [8];
  LocationRecorder location_1;
  ErrorMaker local_e8;
  string_view local_d8;
  string_view local_c8;
  ErrorMaker local_b8;
  undefined1 local_a8 [8];
  LocationRecorder location;
  string_view local_88 [2];
  string_view local_68;
  undefined1 local_58 [8];
  string identifier;
  NamePart *name;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *part_location_local;
  UninterpretedOption *uninterpreted_option_local;
  Parser *this_local;
  
  identifier.field_2._8_8_ = UninterpretedOption::add_name(uninterpreted_option);
  std::__cxx11::string::string((string *)local_58);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"(");
  bVar1 = LookingAt(this,local_68);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_88,"(");
    bVar1 = Consume(this,local_88[0]);
    if (!bVar1) {
      this_local._7_1_ = 0;
      location.location_._4_4_ = 1;
      goto LAB_002bf009;
    }
    LocationRecorder::LocationRecorder((LocationRecorder *)local_a8,part_location,1);
    bVar1 = LookingAtType(this,TYPE_IDENTIFIER);
    if (bVar1) {
      ErrorMaker::ErrorMaker(&local_b8,"Expected identifier.");
      bVar1 = ConsumeIdentifier(this,(string *)local_58,local_b8);
      if (bVar1) {
        psVar2 = UninterpretedOption_NamePart::mutable_name_part_abi_cxx11_
                           ((UninterpretedOption_NamePart *)identifier.field_2._8_8_);
        std::__cxx11::string::append((string *)psVar2);
        goto LAB_002bed45;
      }
      this_local._7_1_ = 0;
      location.location_._4_4_ = 1;
    }
    else {
LAB_002bed45:
      while( true ) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,".");
        bVar1 = LookingAt(this,local_c8);
        if (!bVar1) break;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d8,".");
        bVar1 = Consume(this,local_d8);
        if (!bVar1) {
          this_local._7_1_ = 0;
          location.location_._4_4_ = 1;
          goto LAB_002bee92;
        }
        psVar2 = UninterpretedOption_NamePart::mutable_name_part_abi_cxx11_
                           ((UninterpretedOption_NamePart *)identifier.field_2._8_8_);
        std::__cxx11::string::append((char *)psVar2);
        ErrorMaker::ErrorMaker(&local_e8,"Expected identifier.");
        bVar1 = ConsumeIdentifier(this,(string *)local_58,local_e8);
        if (!bVar1) {
          this_local._7_1_ = 0;
          location.location_._4_4_ = 1;
          goto LAB_002bee92;
        }
        psVar2 = UninterpretedOption_NamePart::mutable_name_part_abi_cxx11_
                           ((UninterpretedOption_NamePart *)identifier.field_2._8_8_);
        std::__cxx11::string::append((string *)psVar2);
      }
      location.location_._4_4_ = 0;
    }
LAB_002bee92:
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_a8);
    if (location.location_._4_4_ != 0) goto LAB_002bf009;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&location_1.location_,")");
    bVar1 = Consume(this,stack0xffffffffffffff08);
    if (!bVar1) {
      this_local._7_1_ = 0;
      location.location_._4_4_ = 1;
      goto LAB_002bf009;
    }
    UninterpretedOption_NamePart::set_is_extension
              ((UninterpretedOption_NamePart *)identifier.field_2._8_8_,true);
  }
  else {
    LocationRecorder::LocationRecorder((LocationRecorder *)local_110,part_location,1);
    ErrorMaker::ErrorMaker(&local_120,"Expected identifier.");
    bVar1 = ConsumeIdentifier(this,(string *)local_58,local_120);
    if (bVar1) {
      psVar2 = UninterpretedOption_NamePart::mutable_name_part_abi_cxx11_
                         ((UninterpretedOption_NamePart *)identifier.field_2._8_8_);
      std::__cxx11::string::append((string *)psVar2);
      UninterpretedOption_NamePart::set_is_extension
                ((UninterpretedOption_NamePart *)identifier.field_2._8_8_,false);
    }
    else {
      this_local._7_1_ = 0;
    }
    location.location_._5_3_ = 0;
    location.location_._4_1_ = !bVar1;
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_110);
    if (location.location_._4_4_ != 0) goto LAB_002bf009;
  }
  this_local._7_1_ = 1;
  location.location_._4_4_ = 1;
LAB_002bf009:
  std::__cxx11::string::~string((string *)local_58);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseOptionNamePart(UninterpretedOption* uninterpreted_option,
                                 const LocationRecorder& part_location,
                                 const FileDescriptorProto* containing_file) {
  UninterpretedOption::NamePart* name = uninterpreted_option->add_name();
  std::string identifier;  // We parse identifiers into this string.
  if (LookingAt("(")) {    // This is an extension.
    DO(Consume("("));

    {
      LocationRecorder location(
          part_location, UninterpretedOption::NamePart::kNamePartFieldNumber);
      // An extension name consists of dot-separated identifiers, and may begin
      // with a dot.
      if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
        DO(ConsumeIdentifier(&identifier, "Expected identifier."));
        name->mutable_name_part()->append(identifier);
      }
      while (LookingAt(".")) {
        DO(Consume("."));
        name->mutable_name_part()->append(".");
        DO(ConsumeIdentifier(&identifier, "Expected identifier."));
        name->mutable_name_part()->append(identifier);
      }
    }

    DO(Consume(")"));
    name->set_is_extension(true);
  } else {  // This is a regular field.
    LocationRecorder location(
        part_location, UninterpretedOption::NamePart::kNamePartFieldNumber);
    DO(ConsumeIdentifier(&identifier, "Expected identifier."));
    name->mutable_name_part()->append(identifier);
    name->set_is_extension(false);
  }
  return true;
}